

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

Object * xt::vector::assocN(Object *__return_storage_ptr__,Vector *v,uint i,Object *val)

{
  uint uVar1;
  uint uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar3;
  _Vector *this_00;
  element_type *peVar4;
  RuntimeException *this_01;
  double __z;
  ObjectArray newTail;
  string local_120;
  element_type *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  ObjectArray local_f0;
  Node local_e0;
  ObjectArray local_d0;
  Node local_c0;
  double local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  Node local_a0;
  _Vector *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  _Vector *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Object local_70;
  Object local_50;
  
  peVar4 = (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = peVar4->cnt;
  if (uVar1 <= i) {
    if (uVar1 != i) {
      this_01 = (RuntimeException *)__cxa_allocate_exception(0x28);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Index out of bounds","")
      ;
      RuntimeException::RuntimeException(this_01,&local_120);
      __cxa_throw(this_01,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    local_f8 = (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_f8->_M_use_count = local_f8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_f8->_M_use_count = local_f8->_M_use_count + 1;
      }
    }
    local_100 = peVar4;
    Object::Object(&local_70,val);
    conj(__z);
    __return_storage_ptr__->type = Pointer;
    __return_storage_ptr__->typeinfo = (TypeInfo *)_Vector::type_info;
    (__return_storage_ptr__->field_2).number = local_b0;
    (__return_storage_ptr__->field_2).ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_a8;
    local_120._M_string_length = (size_type)local_f8;
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_a8->_M_use_count = local_a8->_M_use_count + 1;
        UNLOCK();
        if (local_a8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001073aa;
      }
      else {
        local_a8->_M_use_count = local_a8->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
      local_120._M_string_length = (size_type)local_f8;
    }
    goto LAB_001073aa;
  }
  this = (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if ((0x1f < uVar1) && (i < (uVar1 - 1 & 0xffffffe0))) goto LAB_00107065;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    uVar1 = peVar4->cnt;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    if ((0x1f < uVar1) && (i < (uVar1 - 1 & 0xffffffe0))) {
LAB_00107065:
      this_00 = (_Vector *)operator_new(0x28);
      peVar4 = (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar1 = peVar4->cnt;
      uVar2 = peVar4->shift;
      local_e0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (peVar4->root).super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_e0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (peVar4->root).super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_e0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_e0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_e0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_e0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_e0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Object::Object(&local_50,val);
      doAssoc((vector *)&local_a0,uVar2,&local_e0,i,&local_50);
      peVar4 = (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_f0.
      super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (peVar4->tail).
                super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_f0.
      super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (peVar4->tail).
           super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_f0.
          super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_f0.
           super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_f0.
                super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_f0.
           super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_f0.
                super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      _Vector::_Vector(this_00,uVar1,uVar2,&local_a0,&local_f0);
      local_90 = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::_Vector*>
                (&local_88,this_00);
      __return_storage_ptr__->type = Pointer;
      __return_storage_ptr__->typeinfo = (TypeInfo *)_Vector::type_info;
      (__return_storage_ptr__->field_2).raw = local_90;
      (__return_storage_ptr__->field_2).ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_88._M_pi;
      if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
          UNLOCK();
          if (local_88._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
          goto LAB_00107349;
        }
        else {
          (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
      }
LAB_00107349:
      if (local_f0.
          super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f0.
                   super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_120._M_string_length =
           (size_type)
           local_e0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
        local_120._M_string_length =
             (size_type)
             local_e0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      }
      goto LAB_001073aa;
    }
    peVar4 = (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  peVar3 = (peVar4->tail).
           super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  new_object_array((xt *)&local_120,
                   (uint)((ulong)((long)*(pointer *)
                                         ((long)&(peVar3->
                                                 super__Vector_base<xt::Object,_std::allocator<xt::Object>_>
                                                 )._M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&(peVar3->
                                           super__Vector_base<xt::Object,_std::allocator<xt::Object>_>
                                           )._M_impl.super__Vector_impl_data) >> 5));
  std::vector<xt::Object,_std::allocator<xt::Object>_>::operator=
            ((vector<xt::Object,_std::allocator<xt::Object>_> *)local_120._M_dataplus._M_p,
             (((v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tail).
             super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  Object::operator=((Object *)((ulong)((i & 0x1f) << 5) + *(long *)local_120._M_dataplus._M_p),val);
  local_80 = (_Vector *)operator_new(0x28);
  peVar4 = (v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = peVar4->cnt;
  uVar2 = peVar4->shift;
  local_c0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar4->root).super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar4->root).super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_c0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_c0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_c0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
  local_d0.
  super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_120._M_dataplus._M_p;
  local_d0.
  super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_120._M_string_length + 8) =
           *(_Atomic_word *)(local_120._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_120._M_string_length + 8) =
           *(_Atomic_word *)(local_120._M_string_length + 8) + 1;
    }
  }
  _Vector::_Vector(local_80,uVar1,uVar2,&local_c0,&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::_Vector*>(&local_78,local_80);
  __return_storage_ptr__->type = Pointer;
  __return_storage_ptr__->typeinfo = (TypeInfo *)_Vector::type_info;
  (__return_storage_ptr__->field_2).raw = local_80;
  (__return_storage_ptr__->field_2).ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_78._M_pi;
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_78._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00107387;
    }
    else {
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
LAB_00107387:
  if (local_d0.
      super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.
               super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
LAB_001073aa:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

Object assocN(Vector v, unsigned int i, Object val) {
	if (i < v->cnt) {
		if (i >= tailoff(v)) {
			ObjectArray newTail = new_object_array(v->tail->size());
			*newTail = *v->tail;
			(*newTail)[i & 0x01f] = val;
			return Vector(new _Vector {v->cnt, v->shift, v->root, newTail});
		}
		return Vector(new _Vector {v->cnt, v->shift, doAssoc(v->shift, v->root, i, val), v->tail});
	}
	if (i == v->cnt) return conj(v, val);
	throw RuntimeException("Index out of bounds");
}